

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O0

string * __thiscall Component::NiceName_abi_cxx11_(Component *this,char sub)

{
  bool bVar1;
  long lVar2;
  char *__old_value;
  path *in_RSI;
  string *in_RDI;
  string *nicename;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa0;
  allocator *paVar3;
  allocator local_26;
  undefined1 local_25;
  allocator local_12 [18];
  
  boost::filesystem::path::string_abi_cxx11_(in_RSI);
  bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (bVar1) {
    paVar3 = local_12;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"ROOT",paVar3);
    std::allocator<char>::~allocator((allocator<char> *)local_12);
  }
  else {
    local_25 = 0;
    boost::filesystem::path::generic_string_abi_cxx11_(in_RSI);
    lVar2 = std::__cxx11::string::c_str();
    __old_value = (char *)(lVar2 + 2);
    __last._M_current = (char *)&local_26;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,__old_value,(allocator *)__last._M_current);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    std::__cxx11::string::begin();
    std::__cxx11::string::end();
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (in_stack_ffffffffffffffa0,__last,__old_value,in_stack_ffffffffffffff88);
  }
  return in_RDI;
}

Assistant:

std::string Component::NiceName(char sub) const {
    if (root.string() == ".") {
        return std::string("ROOT");
    }

    std::string nicename = root.generic_string().c_str() + 2;
    std::replace(nicename.begin(), nicename.end(), '/', sub);
    return nicename;
}